

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.hpp
# Opt level: O3

int boost::unit_test::ut_detail::case_ins<const_char>::compare(char *s1,char *s2,size_t n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  
  if (n == 0) {
    return 0;
  }
  sVar4 = 0;
  do {
    cVar1 = s2[sVar4];
    iVar2 = toupper((int)s1[sVar4]);
    iVar3 = toupper((int)cVar1);
    if (iVar2 != iVar3) {
      return (uint)(iVar3 <= iVar2) * 2 + -1;
    }
    sVar4 = sVar4 + 1;
  } while (n != sVar4);
  return 0;
}

Assistant:

static int          compare( CharT const* s1, CharT const* s2, std::size_t n )
    {
        for( std::size_t i = 0; i < n; ++i ) {
            if( !eq( s1[i], s2[i] ) )
                return lt( s1[i], s2[i] ) ? -1 : 1;
        }
        return 0;
    }